

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O1

bool __thiscall
absl::log_internal::EncodeBytes
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  anon_unknown_1 *paVar1;
  anon_unknown_1 *paVar2;
  size_t sVar3;
  size_t sVar4;
  anon_unknown_1 *paVar5;
  Span<char> *pSVar6;
  Span<char> *pSVar7;
  anon_unknown_1 *paVar8;
  anon_unknown_1 *extraout_RDX;
  undefined8 *size;
  void *value_00;
  pointer __dest;
  anon_unknown_1 *paVar9;
  undefined1 uVar10;
  anon_unknown_1 *this_00;
  
  pSVar7 = (Span<char> *)value.len_;
  paVar8 = (anon_unknown_1 *)value.ptr_;
  paVar1 = (anon_unknown_1 *)((long)this * 8 + 2);
  pSVar6 = pSVar7;
  sVar3 = VarintSize((uint64_t)paVar1);
  sVar4 = VarintSize((uint64_t)paVar8);
  paVar9 = (anon_unknown_1 *)pSVar7->len_;
  if (paVar9 < paVar8 + sVar3 + sVar4) {
    pSVar6 = (Span<char> *)0x0;
  }
  else {
    anon_unknown_1::EncodeRawVarint(paVar1,sVar3,(size_t)pSVar7,pSVar6);
    anon_unknown_1::EncodeRawVarint(paVar8,sVar4,(size_t)pSVar7,pSVar6);
    __dest = pSVar7->ptr_;
    memcpy(__dest,(void *)tag,(size_t)paVar8);
    pSVar6 = (Span<char> *)((anon_unknown_1 *)pSVar7->len_ + -(long)paVar8);
    if ((anon_unknown_1 *)pSVar7->len_ < paVar8) {
      EncodeBytes();
      paVar1 = (anon_unknown_1 *)((long)__dest * 8 + 2);
      pSVar7 = pSVar6;
      value_00 = (void *)tag;
      sVar3 = VarintSize((uint64_t)paVar1);
      paVar9 = (anon_unknown_1 *)pSVar6->len_;
      if (extraout_RDX <= paVar9) {
        paVar9 = extraout_RDX;
      }
      sVar4 = VarintSize((uint64_t)paVar9);
      paVar8 = (anon_unknown_1 *)(sVar4 + sVar3);
      paVar2 = (anon_unknown_1 *)pSVar6->len_;
      this_00 = extraout_RDX;
      if (((paVar8 <= paVar2) &&
          (paVar5 = paVar8 + (long)extraout_RDX + -(long)paVar2,
          paVar2 <= paVar8 + (long)extraout_RDX && paVar5 != (anon_unknown_1 *)0x0)) &&
         (this_00 = extraout_RDX + -(long)paVar5, extraout_RDX < paVar5)) {
LAB_0012ce73:
        EncodeBytesTruncate();
        paVar1 = (anon_unknown_1 *)((long)paVar9 * 8 + 2);
        sVar3 = VarintSize((uint64_t)paVar1);
        if ((void *)size[1] < value_00) {
          value_00 = (void *)size[1];
        }
        sVar4 = VarintSize((uint64_t)value_00);
        if ((ulong)size[1] < sVar4 + sVar3) {
          size[1] = 0;
          uVar10 = 0;
        }
        else {
          anon_unknown_1::EncodeRawVarint(paVar1,sVar3,(size_t)size,pSVar7);
          uVar10 = (undefined1)*size;
          anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)0x0,sVar4,(size_t)size,pSVar7);
        }
        return (bool)uVar10;
      }
      if (paVar2 < paVar8 + (long)this_00) {
        pSVar7 = (Span<char> *)0x0;
      }
      else {
        anon_unknown_1::EncodeRawVarint(paVar1,sVar3,(size_t)pSVar6,pSVar7);
        anon_unknown_1::EncodeRawVarint(this_00,sVar4,(size_t)pSVar6,pSVar7);
        paVar9 = (anon_unknown_1 *)pSVar6->ptr_;
        memcpy(paVar9,(void *)tag,(size_t)this_00);
        pSVar7 = (Span<char> *)((anon_unknown_1 *)pSVar6->len_ + -(long)this_00);
        if ((anon_unknown_1 *)pSVar6->len_ < this_00) {
          EncodeBytesTruncate();
          value_00 = (void *)tag;
          goto LAB_0012ce73;
        }
        pSVar6->ptr_ = (pointer)(this_00 + (long)pSVar6->ptr_);
      }
      pSVar6->len_ = (size_type)pSVar7;
      return paVar8 + (long)this_00 <= paVar2;
    }
    pSVar7->ptr_ = (pointer)(paVar8 + (long)pSVar7->ptr_);
  }
  pSVar7->len_ = (size_type)pSVar6;
  return paVar8 + sVar3 + sVar4 <= paVar9;
}

Assistant:

bool EncodeBytes(uint64_t tag, absl::Span<const char> value,
                 absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size = VarintSize(length);
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}